

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint64_t helper_neon_qneg_s64_arm(CPUARMState *env,uint64_t x)

{
  if (x == 0x8000000000000000) {
    (env->vfp).qc[0] = 1;
    return 0x7fffffffffffffff;
  }
  return -x;
}

Assistant:

uint64_t HELPER(neon_qneg_s64)(CPUARMState *env, uint64_t x)
{
    if (x == SIGNBIT64) {
        SET_QC();
        x = ~SIGNBIT64;
    } else {
#ifdef _MSC_VER
        x = 0 - x;
#else
        x = -x;
#endif
    }
    return x;
}